

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QModelIndexList * __thiscall
QTreeView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QTreeView *this)

{
  undefined8 *puVar1;
  char cVar2;
  QItemSelectionModel *pQVar3;
  long *plVar4;
  long *plVar5;
  long in_FS_OFFSET;
  long local_88;
  QArrayData *local_80;
  QArrayData *local_70;
  long local_68;
  long *plStack_60;
  QArrayData *local_58;
  long lStack_50;
  long *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  if (pQVar3 == (QItemSelectionModel *)0x0) {
    local_80 = (QArrayData *)0x0;
    local_88 = 0;
    plVar5 = (long *)0x0;
  }
  else {
    QAbstractItemView::selectionModel((QAbstractItemView *)this);
    QItemSelectionModel::selectedIndexes();
    plVar5 = local_48;
    local_80 = local_58;
    local_88 = lStack_50;
    local_58 = (QArrayData *)0x0;
    lStack_50 = 0;
    local_48 = (long *)0x0;
  }
  if (plVar5 != (long *)0x0) {
    plVar4 = (long *)0x0;
    do {
      puVar1 = (undefined8 *)(local_88 + (long)plVar4 * 0x18);
      local_58 = (QArrayData *)*puVar1;
      lStack_50 = puVar1[1];
      local_48 = *(long **)(local_88 + 0x10 + (long)plVar4 * 0x18);
      while ((((-1 < (int)local_58 && (-1 < (long)local_58)) && (local_48 != (long *)0x0)) &&
             (cVar2 = (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                  0x2c0))(this,&local_58), cVar2 == '\0'))) {
        if (local_48 == (long *)0x0) {
          local_70 = (QArrayData *)0xffffffffffffffff;
          local_68 = 0;
          plStack_60 = (long *)0x0;
        }
        else {
          (**(code **)(*local_48 + 0x68))(&local_70,local_48,&local_58);
        }
        local_48 = plStack_60;
        local_58 = local_70;
        lStack_50 = local_68;
      }
      if ((((int)local_58 < 0) || ((long)local_58 < 0)) || (local_48 == (long *)0x0)) {
        QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                  ((QMovableArrayOps<QModelIndex> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,(QModelIndex *)(local_88 + (long)plVar4 * 0x18))
        ;
        QList<QModelIndex>::end(__return_storage_ptr__);
      }
      plVar4 = (long *)((long)plVar4 + 1);
    } while (plVar4 != plVar5);
  }
  if (local_80 != (QArrayData *)0x0) {
    LOCK();
    (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_80,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QTreeView::selectedIndexes() const
{
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (selectionModel())
        modelSelected = selectionModel()->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        // check that neither the parents nor the index is hidden before we add
        QModelIndex index = modelSelected.at(i);
        while (index.isValid() && !isIndexHidden(index))
            index = index.parent();
        if (index.isValid())
            continue;
        viewSelected.append(modelSelected.at(i));
    }
    return viewSelected;
}